

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTableGen.cpp
# Opt level: O3

void __thiscall
SGParser::Generator::ParseTableGen::AllocateTables
          (ParseTableGen *this,size_t stateCount,size_t terminalCount,size_t nonTerminalCount)

{
  pointer *pppuVar1;
  iterator iVar2;
  uint16_t *this_00;
  unsigned_short *puVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  unsigned_short *local_50;
  uint16_t *newActionTable;
  uint16_t *newGotoTable;
  size_t local_38;
  
  local_38 = nonTerminalCount;
  ParseTable::FreeTables(&this->super_ParseTable);
  (this->super_ParseTable).ActionWidth = terminalCount;
  newGotoTable = (uint16_t *)&(this->super_ParseTable).ActionTable;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve
            ((vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> *)newGotoTable,stateCount)
  ;
  sVar7 = (this->super_ParseTable).ActionWidth;
  lVar4 = sVar7 * stateCount;
  uVar6 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar6 = lVar4 * 2;
  }
  puVar3 = (unsigned_short *)operator_new__(uVar6);
  local_50 = puVar3;
  if (lVar4 != 0) {
    memset(puVar3,0,lVar4 * 2);
  }
  sVar5 = stateCount;
  if (stateCount != 0) {
    do {
      iVar2._M_current =
           (this->super_ParseTable).ActionTable.
           super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->super_ParseTable).ActionTable.
          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short*,std::allocator<unsigned_short*>>::
        _M_realloc_insert<unsigned_short*const&>
                  ((vector<unsigned_short*,std::allocator<unsigned_short*>> *)newGotoTable,iVar2,
                   &local_50);
        sVar7 = (this->super_ParseTable).ActionWidth;
      }
      else {
        *iVar2._M_current = puVar3;
        pppuVar1 = &(this->super_ParseTable).ActionTable.
                    super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppuVar1 = *pppuVar1 + 1;
      }
      puVar3 = local_50 + sVar7;
      sVar5 = sVar5 - 1;
      local_50 = puVar3;
    } while (sVar5 != 0);
  }
  (this->super_ParseTable).GotoWidth = local_38;
  newGotoTable = (uint16_t *)&(this->super_ParseTable).GotoTable;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve
            ((vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> *)newGotoTable,stateCount)
  ;
  sVar7 = (this->super_ParseTable).GotoWidth;
  lVar4 = sVar7 * stateCount;
  local_38 = lVar4 * 2;
  uVar6 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar6 = local_38;
  }
  puVar3 = (unsigned_short *)operator_new__(uVar6);
  newActionTable = puVar3;
  if (lVar4 != 0) {
    memset(puVar3,0xff,local_38);
  }
  this_00 = newGotoTable;
  if (stateCount != 0) {
    do {
      iVar2._M_current =
           (this->super_ParseTable).GotoTable.
           super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->super_ParseTable).GotoTable.
          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short*,std::allocator<unsigned_short*>>::
        _M_realloc_insert<unsigned_short*const&>
                  ((vector<unsigned_short*,std::allocator<unsigned_short*>> *)this_00,iVar2,
                   &newActionTable);
        sVar7 = (this->super_ParseTable).GotoWidth;
      }
      else {
        *iVar2._M_current = puVar3;
        pppuVar1 = &(this->super_ParseTable).GotoTable.
                    super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppuVar1 = *pppuVar1 + 1;
      }
      puVar3 = newActionTable + sVar7;
      stateCount = stateCount - 1;
      newActionTable = puVar3;
    } while (stateCount != 0);
  }
  return;
}

Assistant:

void ParseTableGen::AllocateTables(size_t stateCount, size_t terminalCount,
                                   size_t nonTerminalCount) {
    FreeTables();

    // *** Allocate memory for the action table

    ActionWidth = terminalCount;
    ActionTable.reserve(stateCount);

    const auto newActionSize  = stateCount * ActionWidth;
    auto       newActionTable = new uint16_t[newActionSize];
    std::fill(newActionTable, newActionTable + newActionSize, uint16_t(0u));

    for (size_t i = 0u; i < stateCount; ++i, newActionTable += ActionWidth)
        ActionTable.push_back(newActionTable);

    // *** Allocate memory for the goto table

    GotoWidth = nonTerminalCount;
    GotoTable.reserve(stateCount);

    const auto newGotoSize  = stateCount * GotoWidth;
    auto       newGotoTable = new uint16_t[newGotoSize];
    std::fill(newGotoTable, newGotoTable + newGotoSize, EmptyGoto);

    for (size_t i = 0u; i < stateCount; ++i, newGotoTable += GotoWidth)
        GotoTable.push_back(newGotoTable);
}